

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mean.hpp
# Opt level: O3

void mean::run(vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_input,
              vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *v_output)

{
  ulong uVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  float local_44;
  
  printf("%s: Running mean...\n","run");
  if ((v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    do {
      pgVar2 = (v_output->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl
               .super__Vector_impl_data._M_start[uVar6];
      uVar1 = uVar6 + 1;
      ggml_format_name(pgVar2,"direction.%zu",uVar1);
      pgVar3 = (v_input->super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar6];
      if (pgVar3->ne[0] != pgVar2->ne[0]) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/cvector-generator/mean.hpp"
                   ,0x16,"GGML_ASSERT(%s) failed","t_layer->ne[0] == ctrl_out->ne[0]");
      }
      if (0 < pgVar3->ne[0]) {
        uVar5 = 0;
        do {
          lVar4 = pgVar3->ne[1];
          fVar9 = 0.0;
          if (0 < lVar4) {
            uVar7 = 0;
            do {
              fVar8 = (float)ggml_get_f32_nd(pgVar3,uVar5 & 0xffffffff,uVar7 & 0xffffffff,0,0);
              fVar9 = fVar9 + fVar8;
              uVar7 = uVar7 + 1;
              lVar4 = pgVar3->ne[1];
            } while ((long)uVar7 < lVar4);
          }
          ggml_set_f32_1d(fVar9 / (float)lVar4,pgVar2,uVar5 & 0xffffffff);
          uVar5 = uVar5 + 1;
        } while ((long)uVar5 < pgVar3->ne[0]);
      }
      lVar4 = ggml_nelements(pgVar2);
      if (lVar4 < 1) {
        local_44 = 0.0;
      }
      else {
        local_44 = 0.0;
        uVar5 = 0;
        do {
          fVar9 = (float)ggml_get_f32_1d(pgVar2,uVar5 & 0xffffffff);
          local_44 = local_44 + fVar9 * fVar9;
          uVar5 = uVar5 + 1;
          lVar4 = ggml_nelements(pgVar2);
        } while ((long)uVar5 < lVar4);
      }
      if (local_44 < 0.0) {
        local_44 = sqrtf(local_44);
      }
      else {
        local_44 = SQRT(local_44);
      }
      lVar4 = ggml_nelements(pgVar2);
      if (0 < lVar4) {
        uVar5 = 0;
        do {
          fVar9 = (float)ggml_get_f32_1d(pgVar2,uVar5 & 0xffffffff);
          ggml_set_f32_1d(fVar9 / local_44,pgVar2,uVar5 & 0xffffffff);
          uVar5 = uVar5 + 1;
          lVar4 = ggml_nelements(pgVar2);
        } while ((long)uVar5 < lVar4);
      }
      printf("%s: Done layer %d / %d\n","run",(ulong)((int)uVar6 + 1));
      uVar6 = uVar1;
    } while (uVar1 < (ulong)((long)(v_input->
                                   super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                             (long)(v_input->
                                   super__Vector_base<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

static void run(
        const std::vector<struct ggml_tensor *> & v_input, // shape of v_input[0]: [n_embd, n_samples]
        const std::vector<struct ggml_tensor *> & v_output) {
    printf("%s: Running mean...\n", __func__);
    for (size_t il = 0; il < v_input.size(); ++il) {
        // prepare output vector
        struct ggml_tensor * ctrl_out = v_output[il];
        ggml_format_name(ctrl_out, "direction.%zu", il+1);

        // calculate mean vector
        struct ggml_tensor * t_layer = v_input[il];
        GGML_ASSERT(t_layer->ne[0] == ctrl_out->ne[0]); // == n_embd
        for (int ic = 0; ic < t_layer->ne[0]; ic++) {
            float f = 0.0;
            for (int ir = 0; ir < t_layer->ne[1]; ir++) {
                f += ggml_get_f32_nd(t_layer, ic, ir, 0, 0);
            }
            f /= t_layer->ne[1];
            ggml_set_f32_1d(ctrl_out, ic, f);
        }

        // normalize output vector
        float norm = 0.0;
        for (int i = 0; i < ggml_nelements(ctrl_out); i++) {
            float f = ggml_get_f32_1d(ctrl_out, i);
            norm += f*f;
        }
        norm = sqrt(norm);
        for (int i = 0; i < ggml_nelements(ctrl_out); i++) {
            float f = ggml_get_f32_1d(ctrl_out, i);
            ggml_set_f32_1d(ctrl_out, i, f / norm);
        }

        printf("%s: Done layer %d / %d\n", __func__, (int) il+1, (int) v_input.size());
    }
}